

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::StdString::CasedString::caseSensitivitySuffix_abi_cxx11_(CasedString *this)

{
  int *in_RSI;
  string *in_RDI;
  allocator local_11 [17];
  
  if (*in_RSI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI," (case insensitive)",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string CasedString::caseSensitivitySuffix() const {
            return m_caseSensitivity == CaseSensitive::No
                   ? " (case insensitive)"
                   : std::string();
        }